

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::PrimitiveColumnWriter::WriteDictionary
          (PrimitiveColumnWriter *this,PrimitiveColumnWriterState *state,
          unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
          *temp_writer,idx_t row_count)

{
  AllocatedData *this_00;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> _Var1;
  long lVar2;
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> uVar3;
  pointer this_01;
  idx_t iVar4;
  type temp_writer_00;
  pointer *__ptr;
  value_type local_250;
  
  duckdb_parquet::PageHeader::PageHeader(&local_250.page_header);
  this_00 = &local_250.compressed_buf;
  local_250.write_page_idx = 0;
  local_250.write_count = 0;
  local_250.temp_writer.
  super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
       (__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>
       )0x0;
  local_250.page_state.
  super_unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
  .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
        )(__uniq_ptr_data<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true,_true>
          )0x0;
  local_250.max_write_count = 0;
  AllocatedData::AllocatedData(this_00);
  this_01 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
            operator->(temp_writer);
  iVar4 = MemoryStream::GetPosition(this_01);
  local_250.page_header.uncompressed_page_size = (int32_t)iVar4;
  local_250.page_header.type = DICTIONARY_PAGE;
  local_250.page_header.__isset = (_PageHeader__isset)((byte)local_250.page_header.__isset | 8);
  local_250.page_header.dictionary_page_header.encoding = PLAIN;
  local_250.page_header.dictionary_page_header.is_sorted = false;
  local_250.page_header.dictionary_page_header.num_values = (int32_t)row_count;
  _Var1._M_head_impl =
       (temp_writer->
       super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)._M_t.
       super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
       super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
  (temp_writer->super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>).
  _M_t.super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl = (MemoryStream *)0x0;
  if (local_250.temp_writer.
      super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
      super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
      super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>)
      0x0) {
    lVar2 = *(long *)local_250.temp_writer.
                     super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>
                     .super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
    local_250.temp_writer.
    super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
    super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
    super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
         (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         _Var1._M_head_impl;
    (**(code **)(lVar2 + 0x10))();
    _Var1._M_head_impl = (MemoryStream *)local_250.temp_writer;
  }
  local_250.temp_writer.
  super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
       (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
       _Var1._M_head_impl;
  local_250.write_count = 0;
  local_250.max_write_count = 0;
  temp_writer_00 =
       unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::operator*
                 (&local_250.temp_writer);
  ColumnWriter::CompressPage
            (&this->super_ColumnWriter,temp_writer_00,&local_250.compressed_size,
             &local_250.compressed_data,this_00);
  uVar3.super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
       (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
       local_250.temp_writer;
  local_250.page_header.compressed_page_size = (int32_t)local_250.compressed_size;
  if (local_250.compressed_buf.pointer != (data_ptr_t)0x0) {
    local_250.temp_writer.
    super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
    super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
    super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
         (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>
          )0x0;
    if (uVar3.super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>.
        _M_t.super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
        super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)uVar3.
                            super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>
                            .super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl +
                  0x10))();
    }
  }
  ::std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>::
  _M_insert_rval(&(state->write_info).
                  super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                 ,(state->write_info).
                  super_vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                  .
                  super__Vector_base<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start,&local_250);
  AllocatedData::~AllocatedData(this_00);
  if (local_250.page_state.
      super_unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
      .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_250.page_state.
        super_unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
        .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl)[1])();
  }
  local_250.page_state.
  super_unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
  .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
        )(__uniq_ptr_data<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true,_true>
          )0x0;
  if (local_250.temp_writer.
      super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
      super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
      super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>)
      0x0) {
    (**(code **)(*(long *)local_250.temp_writer.
                          super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>
                          .super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl + 0x10)
    )();
  }
  local_250.temp_writer.
  super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
       (__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>
       )0x0;
  duckdb_parquet::PageHeader::~PageHeader(&local_250.page_header);
  return;
}

Assistant:

void PrimitiveColumnWriter::WriteDictionary(PrimitiveColumnWriterState &state, unique_ptr<MemoryStream> temp_writer,
                                            idx_t row_count) {
	D_ASSERT(temp_writer);
	D_ASSERT(temp_writer->GetPosition() > 0);

	// write the dictionary page header
	PageWriteInformation write_info;
	// set up the header
	auto &hdr = write_info.page_header;
	hdr.uncompressed_page_size = UnsafeNumericCast<int32_t>(temp_writer->GetPosition());
	hdr.type = PageType::DICTIONARY_PAGE;
	hdr.__isset.dictionary_page_header = true;

	hdr.dictionary_page_header.encoding = Encoding::PLAIN;
	hdr.dictionary_page_header.is_sorted = false;
	hdr.dictionary_page_header.num_values = UnsafeNumericCast<int32_t>(row_count);

	write_info.temp_writer = std::move(temp_writer);
	write_info.write_count = 0;
	write_info.max_write_count = 0;

	// compress the contents of the dictionary page
	CompressPage(*write_info.temp_writer, write_info.compressed_size, write_info.compressed_data,
	             write_info.compressed_buf);
	hdr.compressed_page_size = UnsafeNumericCast<int32_t>(write_info.compressed_size);

	if (write_info.compressed_buf) {
		// if the data has been compressed, we no longer need the uncompressed data
		D_ASSERT(write_info.compressed_buf.get() == write_info.compressed_data);
		write_info.temp_writer.reset();
	}

	// insert the dictionary page as the first page to write for this column
	state.write_info.insert(state.write_info.begin(), std::move(write_info));
}